

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.hpp
# Opt level: O0

ggml_status
PCA::compute_piter(pca_params *params,pca_model *model,ggml_cgraph *gf,ggml_gallocr_t allocr,
                  pca_result *result)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  reference ppgVar4;
  reference pvVar5;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  undefined4 *in_RDI;
  undefined8 *in_R8;
  float d;
  int iter;
  ggml_tensor *node;
  int i;
  anon_class_1_0_00000001 extract_i;
  ggml_status res;
  char *in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  byte in_stack_fffffffffffffe87;
  undefined4 in_stack_fffffffffffffe98;
  value_type vVar6;
  undefined4 in_stack_fffffffffffffe9c;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffea0;
  allocator<char> *in_stack_fffffffffffffeb0;
  value_type in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  string *prefix;
  anon_class_1_0_00000001 *this;
  allocator<char> local_119;
  string local_118 [32];
  value_type local_f8;
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [39];
  anon_class_1_0_00000001 local_a1;
  string local_a0 [55];
  allocator<char> local_69;
  string local_68 [36];
  int local_44;
  value_type local_40;
  int local_34;
  ggml_status local_2c;
  undefined8 *local_28;
  undefined8 local_18;
  undefined8 *local_10;
  undefined4 *local_8;
  
  local_28 = in_R8;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  ggml_gallocr_alloc_graph(in_RCX,in_RDX);
  uVar3 = ggml_backend_is_cpu(*local_10);
  if ((uVar3 & 1) != 0) {
    ggml_backend_cpu_set_n_threads(*local_10,*local_8);
  }
  local_2c = ggml_backend_graph_compute(*local_10,local_18);
  if (local_2c == GGML_STATUS_SUCCESS) {
    *local_28 = 0;
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::clear
              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x17c741);
    std::vector<float,_std::allocator<float>_>::clear
              ((vector<float,_std::allocator<float>_> *)0x17c752);
    std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::resize
              ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)in_stack_fffffffffffffea0,
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    std::vector<float,_std::allocator<float>_>::resize
              (in_stack_fffffffffffffea0,
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    for (local_34 = 0; iVar2 = local_34, iVar1 = ggml_graph_n_nodes(local_18), iVar2 < iVar1;
        local_34 = local_34 + 1) {
      local_40 = (value_type)ggml_graph_node(local_18,local_34);
      local_44 = 0xffffffff;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      prefix = (string *)local_40->name;
      this = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffec4 =
           compute_piter::anon_class_1_0_00000001::operator()
                     (this,prefix,
                      (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      local_44 = in_stack_fffffffffffffec4;
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      std::__cxx11::string::~string(local_68);
      std::allocator<char>::~allocator(&local_69);
      if (-1 < in_stack_fffffffffffffec4) {
        in_stack_fffffffffffffeb8 = local_40;
        ppgVar4 = std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::operator[]
                            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)(local_28 + 1)
                             ,(long)local_44);
        *ppgVar4 = in_stack_fffffffffffffeb8;
      }
      in_stack_fffffffffffffeb0 = &local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      iVar2 = compute_piter::anon_class_1_0_00000001::operator()
                        (this,prefix,
                         (string *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      local_44 = iVar2;
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator(&local_f1);
      std::__cxx11::string::~string(local_c8);
      std::allocator<char>::~allocator(&local_c9);
      if (-1 < iVar2) {
        ggml_backend_tensor_get(local_40,&local_f8,0,4);
        vVar6 = local_f8;
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_28 + 4),(long)local_44);
        *pvVar5 = vVar6;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                 (char *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffe87 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
                           in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(local_118);
      std::allocator<char>::~allocator(&local_119);
      if ((in_stack_fffffffffffffe87 & 1) != 0) {
        *local_28 = local_40;
      }
    }
  }
  return local_2c;
}

Assistant:

static ggml_status compute_piter(
        const struct pca_params & params,
        const pca_model & model,
        struct ggml_cgraph * gf,
        ggml_gallocr_t allocr,
        struct pca_result & result) {
    // allocate tensors
    ggml_gallocr_alloc_graph(allocr, gf);

    if (ggml_backend_is_cpu(model.backend)) {
        ggml_backend_cpu_set_n_threads(model.backend, params.n_threads);
    }

    ggml_status res = ggml_backend_graph_compute(model.backend, gf);
    if (res == GGML_STATUS_SUCCESS) {
        auto extract_i = [](std::string prefix, std::string str) -> int {
            int i = -1;
            if (str.rfind(prefix, 0) == 0) {
                sscanf(str.c_str(), (prefix + "%d").c_str(), &i);
            }
            return i;
        };
        result.calculated_square = NULL;
        result.eigenvectors.clear();
        result.distances.clear();
        result.eigenvectors.resize(params.n_batch);
        result.distances.resize(params.n_batch);
        // get output nodes
        for (int i = 0; i < ggml_graph_n_nodes(gf); ++i) {
            auto node = ggml_graph_node(gf, i);
            int iter = -1;
            // find b_tensor (without copying data from device)
            if ((iter = extract_i("b_tensor_norm_", node->name)) > -1) {
                result.eigenvectors[iter] = node;
            }
            // find distances, then copy data from device
            if ((iter = extract_i("distance_", node->name)) > -1) {
                float d;
                ggml_backend_tensor_get(node, &d, 0, sizeof(float));
                result.distances[iter] = d;
                // std::cout << node->name << " = " << d << "\n";
            }
            // find tmp_square if it exists (without copying data from device)
            if (std::string(node->name) == "tmp_square") {
                result.calculated_square = node;
            }
        }
    }
    return res;
}